

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void __thiscall HighsBasis::clear(HighsBasis *this)

{
  pointer pHVar1;
  
  this->valid = false;
  this->alien = true;
  this->useful = false;
  this->was_alien = true;
  this->debug_id = -1;
  this->debug_update_count = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&this->debug_origin_name,0,(char *)(this->debug_origin_name)._M_string_length,
             0x3c5a3e);
  pHVar1 = (this->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar1) {
    (this->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar1;
  }
  pHVar1 = (this->col_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar1) {
    (this->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar1;
  }
  return;
}

Assistant:

void HighsBasis::clear() {
  this->invalidate();
  this->row_status.clear();
  this->col_status.clear();
}